

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O3

Value * __thiscall xmrig::JsonReader::getValue(JsonReader *this,char *key)

{
  Value *name;
  Number in_RAX;
  Value *pVVar1;
  undefined8 local_18;
  
  name = this->m_obj;
  local_18 = in_RAX;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&stack0xffffffffffffffe8,(Ch *)name);
  pVVar1 = (Value *)kNullValue;
  if (local_18 !=
      (ulong)(name->data_).s.length * 0x20 + ((ulong)(name->data_).s.str & 0xffffffffffff)) {
    pVVar1 = (Value *)(local_18 + 0x10);
  }
  return pVVar1;
}

Assistant:

inline const rapidjson::Value &getValue(const char *key) const override                          { return Json::getValue(m_obj, key); }